

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeComponentGraph.cxx
# Opt level: O2

void __thiscall cmComputeComponentGraph::~cmComputeComponentGraph(cmComputeComponentGraph *this)

{
  std::_Deque_base<int,_std::allocator<int>_>::~_Deque_base
            ((_Deque_base<int,_std::allocator<int>_> *)&this->TarjanStack);
  std::vector<cmGraphNodeList,_std::allocator<cmGraphNodeList>_>::~vector(&this->Components);
  std::
  _Vector_base<cmComputeComponentGraph::TarjanEntry,_std::allocator<cmComputeComponentGraph::TarjanEntry>_>
  ::~_Vector_base(&(this->TarjanEntries).
                   super__Vector_base<cmComputeComponentGraph::TarjanEntry,_std::allocator<cmComputeComponentGraph::TarjanEntry>_>
                 );
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&(this->TarjanComponents).super__Vector_base<int,_std::allocator<int>_>);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&(this->TarjanVisited).super__Vector_base<int,_std::allocator<int>_>);
  std::vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>::~vector
            (&(this->ComponentGraph).super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>
            );
  return;
}

Assistant:

cmComputeComponentGraph::~cmComputeComponentGraph() = default;